

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::TableMacroExtractor::GetMacroDefinition
                  (Value *__return_storage_ptr__,TableMacroCatalogEntry *entry,idx_t offset)

{
  reference this;
  type this_00;
  TableMacroFunction *pTVar1;
  pointer pQVar2;
  LogicalType LStack_48;
  string local_30;
  
  this = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
         ::get<true>(&(entry->super_MacroCatalogEntry).macros,offset);
  this_00 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
            operator*(this);
  if (this_00->type == TABLE_MACRO) {
    pTVar1 = MacroFunction::Cast<duckdb::TableMacroFunction>(this_00);
    pQVar2 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       (&pTVar1->query_node);
    (*pQVar2->_vptr_QueryNode[3])(&local_30,pQVar2);
    Value::Value(__return_storage_ptr__,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    LogicalType::LogicalType(&LStack_48,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_48);
    LogicalType::~LogicalType(&LStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value GetMacroDefinition(TableMacroCatalogEntry &entry, idx_t offset) {
		auto &macro_entry = *entry.macros[offset];
		if (macro_entry.type == MacroType::TABLE_MACRO) {
			auto &func = macro_entry.Cast<TableMacroFunction>();
			return func.query_node->ToString();
		}
		return Value();
	}